

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

void split_common(saucy *s,coloring *c,int cf,int ff)

{
  int iVar1;
  int *piVar2;
  
  piVar2 = c->clen;
  iVar1 = piVar2[cf];
  piVar2[cf] = ~cf + ff;
  piVar2[ff] = (cf - ff) + iVar1;
  fix_fronts(c,ff,ff);
  if ((s->indmark[cf] == '\0') && (c->clen[cf] <= c->clen[ff])) {
    ff = cf;
  }
  add_induce(s,c,ff);
  return;
}

Assistant:

static void
split_common(struct saucy *s, struct coloring *c, int cf, int ff)
{
    split_color(c, cf, ff);

    /* Add to refinement */
    if (s->indmark[cf] || c->clen[ff] < c->clen[cf]) {
        add_induce(s, c, ff);
    }
    else {
        add_induce(s, c, cf);
    }
}